

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_emit.cc
# Opt level: O1

void re2c::output_if(OutputFile *o,uint32_t ind,bool *readCh,string *compare,uint32_t value)

{
  OutputFile *pOVar1;
  bool *readCh_00;
  string local_48;
  
  pOVar1 = OutputFile::wind(o,ind);
  pOVar1 = OutputFile::ws(pOVar1,"if (");
  output_yych_abi_cxx11_(&local_48,(re2c *)readCh,readCh_00);
  pOVar1 = OutputFile::wstring(pOVar1,&local_48);
  pOVar1 = OutputFile::ws(pOVar1," ");
  pOVar1 = OutputFile::wstring(pOVar1,compare);
  pOVar1 = OutputFile::ws(pOVar1," ");
  pOVar1 = OutputFile::wc_hex(pOVar1,value);
  OutputFile::ws(pOVar1,") ");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void output_if (OutputFile & o, uint32_t ind, bool & readCh, const std::string & compare, uint32_t value)
{
	o.wind(ind).ws("if (").wstring(output_yych (readCh)).ws(" ").wstring(compare).ws(" ").wc_hex (value).ws(") ");
}